

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

void Bfree(Bigint *v)

{
  Bigint *v_local;
  
  if (v != (Bigint *)0x0) {
    ckd_free(v);
  }
  return;
}

Assistant:

static void
Bfree(Bigint *v)
{
    if (v) {
        if (v->k > Kmax)
            FREE((void*)v);
        else {
            v->next = freelist[v->k];
            freelist[v->k] = v;
        }
    }
}